

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_tonumber_(TValue *obj,lua_Number *n)

{
  int iVar1;
  TValue v;
  Value local_18;
  char local_10;
  
  if (obj->tt_ == '\x03') {
    local_18.n = (lua_Number)(obj->value_).i;
  }
  else {
    iVar1 = l_strton(obj,(TValue *)&local_18);
    if (iVar1 == 0) {
      return 0;
    }
    if (local_10 == '\x03') {
      local_18.n = (lua_Number)local_18.i;
    }
  }
  *n = (lua_Number)local_18;
  return 1;
}

Assistant:

int luaV_tonumber_ (const TValue *obj, lua_Number *n) {
  TValue v;
  if (ttisinteger(obj)) {
    *n = cast_num(ivalue(obj));
    return 1;
  }
  else if (l_strton(obj, &v)) {  /* string coercible to number? */
    *n = nvalue(&v);  /* convert result of 'luaO_str2num' to a float */
    return 1;
  }
  else
    return 0;  /* conversion failed */
}